

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::EnsureDebugObject(JavascriptLibrary *this,DynamicObject *newDebugObject)

{
  GlobalObject *object;
  code *pcVar1;
  bool bVar2;
  DynamicObject **ppDVar3;
  undefined4 *puVar4;
  GlobalObject **ppGVar5;
  DynamicObject *newDebugObject_local;
  JavascriptLibrary *this_local;
  
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).debugObject);
  if (*ppDVar3 != (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x738,"(!debugObject)","!debugObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).debugObject);
  if (*ppDVar3 == (DynamicObject *)0x0) {
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).debugObject,newDebugObject);
    ppGVar5 = Memory::WriteBarrierPtr::operator_cast_to_GlobalObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).globalObject);
    object = *ppGVar5;
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).debugObject);
    AddMember(this,(DynamicObject *)object,0x1cc,*ppDVar3);
  }
  return;
}

Assistant:

void JavascriptLibrary::EnsureDebugObject(DynamicObject* newDebugObject)
    {
        Assert(!debugObject);

        if (!debugObject)
        {
            this->debugObject = newDebugObject;
            AddMember(globalObject, PropertyIds::Debug, debugObject);
        }
    }